

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int test_5_3_1::del_hash(int *h,int k,int n)

{
  allocator local_b1;
  string local_b0 [36];
  int local_8c;
  int local_88;
  int d;
  int j;
  allocator local_49;
  string local_48 [36];
  int local_24;
  int local_20;
  int i;
  int n_local;
  int k_local;
  int *h_local;
  
  local_88 = k % 7;
  local_24 = local_88;
  local_20 = n;
  i = k;
  _n_local = h;
  if ((long)h[local_88] == 0x7fffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,anon_var_dwarf_f27,&local_49);
    h_local._4_4_ = errCode((string *)local_48,0);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else if (h[local_88] == k) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j,anon_var_dwarf_f32,(allocator *)((long)&d + 3));
    h_local._4_4_ = errCode((string *)&j,1);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&d + 3));
  }
  else {
    for (local_8c = 1; local_8c <= n + -1; local_8c = local_8c + 1) {
      local_24 = (local_88 + local_8c) % 7;
      if ((long)h[local_24] == 0x7fffffffffffffff) {
        return 0;
      }
      if (h[local_24] == k) {
        h[local_24] = -1;
        return 1;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,anon_var_dwarf_f27,&local_b1);
    h_local._4_4_ = errCode((string *)local_b0,0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  return h_local._4_4_;
}

Assistant:

int del_hash(int *h, int k, int n) {
        int i = k % 7;
        if (h[i] == INTMAX_MAX)
            return errCode("没有这个关键字", 0);
        if (h[i] == k) {
            h[i] == INTMAX_MAX;
            return errCode("删除成功", 1);
        } else {
            int j = i;
            for (int d = 1; d <= n - 1; d++) {
                i = (j + d) % 7;
                if (h[i] == INTMAX_MAX)
                    return 0;
                if (h[i] == k) {
                    h[i] = INTMAX_MAX;
                    return 1;
                }
            }
            return errCode("没有这个关键字", 0);
        }
    }